

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_posix.cpp
# Opt level: O2

void pstore::threads::set_name(not_null<const_char_*> name)

{
  errno_erc erc;
  pthread_t __target_thread;
  
  __target_thread = pthread_self();
  erc.err_ = pthread_setname_np(__target_thread,name.ptr_);
  if (erc.err_ == 0) {
    return;
  }
  raise<pstore::errno_erc,char[18]>(erc,(char (*) [18])"threads::set_name");
}

Assistant:

void set_name (gsl::not_null<gsl::czstring> const name) {
            // pthread support for setting thread names comes in various non-portable forms.
            // Here I'm supporting four versions:
            // - the single argument version used by macOS.
            // - two argument form supported by Linux.
            // - three argument form supported by NetBSD.
            // - the slightly differently named form used in FreeBSD.
            int err = 0;
#    if USE_FALLBACK
            std::strncpy (thread_name, name, name_size);
            thread_name[name_size - 1] = '\0';
#    elif defined(PSTORE_PTHREAD_SETNAME_NP_1_ARG)
            err = pthread_setname_np (name);
#    elif defined(PSTORE_PTHREAD_SETNAME_NP_2_ARGS)
            err = pthread_setname_np (pthread_self (), name);
#    elif defined(PSTORE_PTHREAD_SETNAME_NP_3_ARGS)
            err = pthread_setname_np (pthread_self (), name, nullptr);
#    elif defined(PSTORE_PTHREAD_SET_NAME_NP)
            pthread_set_name_np (pthread_self (), name);
#    else
#        error "Don't know how to set the name of the current thread"
#    endif
            if (err != 0) {
                raise (errno_erc{err}, "threads::set_name");
            }
        }